

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedmemory_systemv.cpp
# Opt level: O3

bool __thiscall QSharedMemorySystemV::detach(QSharedMemorySystemV *this,QSharedMemoryPrivate *self)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  long in_FS_OFFSET;
  QLatin1StringView function;
  QAnyStringView a;
  QString local_48;
  QString local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = shmdt(self->memory);
  if (iVar2 < 0) {
    piVar3 = __errno_location();
    if (*piVar3 == 0x16) {
      QMetaObject::tr(&local_48,&QSharedMemory::staticMetaObject,"%1: not attached",(char *)0x0,-1);
      a.m_size = 0x4000000000000015;
      a.field_0.m_data_utf8 = "QSharedMemory::detach";
      QString::arg_impl(&local_30,&local_48,a,0,(QChar)0x20);
      self->error = NotFound;
      QString::operator=(&self->errorString,&local_30);
      if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    else {
      function.m_data = "QSharedMemory::detach";
      function.m_size = 0x15;
      QSharedMemoryPrivate::setUnixErrorString(self,function);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return false;
    }
  }
  else {
    self->memory = (void *)0x0;
    self->size = 0;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      bVar1 = cleanHandle(this,self);
      return bVar1;
    }
  }
  __stack_chk_fail();
}

Assistant:

bool QSharedMemorySystemV::detach(QSharedMemoryPrivate *self)
{
    // detach from the memory segment
    if (shmdt(self->memory) < 0) {
        const auto function = "QSharedMemory::detach"_L1;
        switch (errno) {
        case EINVAL:
            self->setError(QSharedMemory::NotFound,
                           QSharedMemory::tr("%1: not attached").arg(function));
            break;
        default:
            self->setUnixErrorString(function);
        }
        return false;
    }
    self->memory = nullptr;
    self->size = 0;

    return cleanHandle(self);
}